

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall Palette::writeSettings(Palette *this,QSettings *settings)

{
  long lVar1;
  undefined1 *puVar2;
  QString color;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QArrayDataPointer<char16_t> local_48;
  
  QSettings::beginGroup((QString *)settings);
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  QSettings::remove((QString *)settings);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  puVar2 = PaletteTU::ColorKeys;
  for (lVar1 = 0; lVar1 != 0x1a0; lVar1 = lVar1 + 0x10) {
    QColor::name((NameFormat)&local_48);
    QVariant::QVariant((QVariant *)&local_68,(QString *)&local_48);
    QSettings::setValue((QString *)settings,(QVariant *)puVar2);
    QVariant::~QVariant((QVariant *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    puVar2 = &(((QVariant *)puVar2)->d).field_0x18;
  }
  QSettings::endGroup();
  return;
}

Assistant:

void Palette::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Palette);
    settings.remove(QString()); // remove everything

    for (int i = 0; i < ColorCount; ++i) {
        QString color = mData[i].name();
        settings.setValue(TU::ColorKeys[i], color);
    }

    settings.endGroup();

}